

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIBase64Decoder::decode(FIBase64Decoder *this,uint8_t *data,size_t len)

{
  long in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  allocator<unsigned_char> local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  size_t len_local;
  uint8_t *data_local;
  FIBase64Decoder *this_local;
  
  len_local = len;
  data_local = data;
  this_local = this;
  std::allocator<unsigned_char>::allocator(&local_51);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,(uchar *)len,
             (uchar *)(len + in_RCX),&local_51);
  FIBase64Value::create((FIBase64Value *)&stack0xffffffffffffffc8,&local_50);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIBase64Value,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,
             (shared_ptr<Assimp::FIBase64Value> *)&stack0xffffffffffffffc8);
  std::shared_ptr<Assimp::FIBase64Value>::~shared_ptr
            ((shared_ptr<Assimp::FIBase64Value> *)&stack0xffffffffffffffc8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
  std::allocator<unsigned_char>::~allocator(&local_51);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIBase64Value::create(std::vector<uint8_t>(data, data + len));
    }